

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

void idct_block(uint8 *out,int out_stride,short *data,uint8 *dequantize)

{
  long lVar1;
  uint8 *puVar2;
  uint8 uVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  uint8 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int aiStack_154 [23];
  int aiStack_f8 [8];
  int local_d8 [8];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  lVar1 = 0;
  do {
    sVar4 = data[lVar1 + 0x10];
    if (sVar4 == 0 && data[lVar1 + 8] == 0) {
      if ((((data[lVar1 + 0x18] != 0) || (data[lVar1 + 0x20] != 0)) || (data[lVar1 + 0x28] != 0)) ||
         ((data[lVar1 + 0x30] != 0 || (data[lVar1 + 0x38] != 0)))) {
        sVar4 = 0;
        goto LAB_0014fa43;
      }
      iVar11 = (uint)dequantize[lVar1] * (int)data[lVar1] * 4;
      aiStack_58[lVar1] = iVar11;
      aiStack_78[lVar1] = iVar11;
      aiStack_98[lVar1] = iVar11;
      aiStack_b8[lVar1] = iVar11;
      local_d8[lVar1] = iVar11;
      aiStack_f8[lVar1] = iVar11;
      aiStack_154[lVar1 + 0xf] = iVar11;
      aiStack_154[lVar1 + 7] = iVar11;
    }
    else {
LAB_0014fa43:
      iVar5 = ((uint)dequantize[lVar1 + 0x30] * (int)data[lVar1 + 0x30] +
              (uint)dequantize[lVar1 + 0x10] * (int)sVar4) * 0x8a9;
      iVar8 = (uint)dequantize[lVar1 + 0x30] * (int)data[lVar1 + 0x30] * -0x1d8f + iVar5;
      iVar5 = (uint)dequantize[lVar1 + 0x10] * (int)sVar4 * 0xc3f + iVar5;
      iVar15 = (uint)dequantize[lVar1 + 0x38] * (int)data[lVar1 + 0x38];
      iVar12 = (uint)dequantize[lVar1 + 0x28] * (int)data[lVar1 + 0x28];
      iVar17 = (uint)dequantize[lVar1 + 0x18] * (int)data[lVar1 + 0x18];
      iVar13 = (uint)dequantize[lVar1 + 8] * (int)data[lVar1 + 8];
      iVar11 = (iVar12 + iVar13 + iVar17 + iVar15) * 0x12d0;
      iVar6 = (iVar15 + iVar13) * -0xe65 + iVar11;
      iVar11 = (iVar17 + iVar12) * -0x2901 + iVar11;
      iVar9 = (iVar12 + iVar13) * -0x63d;
      iVar10 = (iVar17 + iVar15) * -0x1f62;
      iVar14 = iVar17 * 0x312a + iVar10 + iVar11;
      iVar11 = iVar12 * 0x20da + iVar9 + iVar11;
      iVar17 = ((uint)dequantize[lVar1 + 0x20] * (int)data[lVar1 + 0x20] +
               (uint)dequantize[lVar1] * (int)data[lVar1]) * 0x1000;
      iVar12 = ((uint)dequantize[lVar1] * (int)data[lVar1] -
               (uint)dequantize[lVar1 + 0x20] * (int)data[lVar1 + 0x20]) * 0x1000;
      iVar13 = iVar13 * 0x1805 + iVar9 + iVar6;
      iVar6 = iVar15 * 0x4c7 + iVar10 + iVar6;
      iVar10 = iVar17 - iVar5;
      iVar5 = iVar17 + 0x200 + iVar5;
      iVar9 = iVar12 - iVar8;
      iVar8 = iVar12 + 0x200 + iVar8;
      aiStack_154[lVar1 + 7] = iVar13 + iVar5 >> 10;
      aiStack_58[lVar1] = iVar5 - iVar13 >> 10;
      aiStack_154[lVar1 + 0xf] = iVar8 + iVar14 >> 10;
      aiStack_78[lVar1] = iVar8 - iVar14 >> 10;
      aiStack_f8[lVar1] = iVar11 + iVar9 + 0x200 >> 10;
      aiStack_98[lVar1] = (iVar9 + 0x200) - iVar11 >> 10;
      local_d8[lVar1] = iVar10 + iVar6 + 0x200 >> 10;
      aiStack_b8[lVar1] = (iVar10 + 0x200) - iVar6 >> 10;
    }
    lVar1 = lVar1 + 1;
    if ((int)lVar1 == 8) {
      puVar2 = out + 7;
      lVar1 = 0x1c;
      do {
        iVar11 = *(int *)((long)aiStack_154 + lVar1 + 8);
        iVar5 = *(int *)((long)aiStack_154 + lVar1 + 0x18);
        iVar17 = (iVar5 + iVar11) * 0x8a9;
        iVar13 = iVar5 * -0x1d8f + iVar17;
        iVar17 = iVar11 * 0xc3f + iVar17;
        iVar11 = *(int *)((long)aiStack_154 + lVar1 + 0x10);
        iVar5 = *(int *)((long)aiStack_154 + lVar1 + 4);
        iVar9 = *(int *)((long)aiStack_154 + lVar1 + 0x1c);
        iVar6 = *(int *)((long)aiStack_154 + lVar1 + 0x14);
        iVar8 = *(int *)((long)aiStack_154 + lVar1 + 0xc);
        iVar12 = (iVar5 + iVar6 + iVar8 + iVar9) * 0x12d0;
        iVar10 = (iVar5 + iVar9) * -0xe65 + iVar12;
        iVar12 = (iVar8 + iVar6) * -0x2901 + iVar12;
        iVar14 = (iVar5 + iVar6) * -0x63d;
        iVar15 = (iVar8 + iVar9) * -0x1f62;
        iVar16 = iVar8 * 0x312a + iVar15 + iVar12;
        iVar12 = iVar6 * 0x20da + iVar14 + iVar12;
        iVar6 = (iVar11 + *(int *)((long)aiStack_154 + lVar1)) * 0x1000;
        iVar11 = (*(int *)((long)aiStack_154 + lVar1) - iVar11) * 0x1000;
        iVar8 = iVar6 - iVar17;
        iVar14 = iVar5 * 0x1805 + iVar14 + iVar10;
        iVar10 = iVar9 * 0x4c7 + iVar15 + iVar10;
        iVar5 = iVar11 - iVar13;
        iVar17 = iVar6 + 0x10000 + iVar17;
        iVar13 = iVar11 + 0x10000 + iVar13;
        iVar11 = iVar14 + iVar17 >> 0x11;
        uVar3 = -(-0x81 < iVar11);
        if ((char)iVar11 == iVar11) {
          uVar3 = (char)iVar11 + 0x80;
        }
        puVar2[-7] = uVar3;
        iVar11 = iVar17 - iVar14 >> 0x11;
        uVar3 = -(-0x81 < iVar11);
        if ((char)iVar11 == iVar11) {
          uVar3 = (char)iVar11 + 0x80;
        }
        iVar11 = iVar16 + iVar13 >> 0x11;
        uVar7 = -(-0x81 < iVar11);
        if ((char)iVar11 == iVar11) {
          uVar7 = (char)iVar11 + 0x80;
        }
        *puVar2 = uVar3;
        puVar2[-6] = uVar7;
        iVar11 = iVar13 - iVar16 >> 0x11;
        uVar3 = -(-0x81 < iVar11);
        if ((char)iVar11 == iVar11) {
          uVar3 = (char)iVar11 + 0x80;
        }
        puVar2[-1] = uVar3;
        iVar11 = iVar5 + iVar12 + 0x10000 >> 0x11;
        uVar3 = -(-0x81 < iVar11);
        if ((char)iVar11 == iVar11) {
          uVar3 = (char)iVar11 + 0x80;
        }
        iVar11 = (iVar5 + 0x10000) - iVar12 >> 0x11;
        uVar7 = -(-0x81 < iVar11);
        if ((char)iVar11 == iVar11) {
          uVar7 = (char)iVar11 + 0x80;
        }
        puVar2[-5] = uVar3;
        puVar2[-2] = uVar7;
        iVar11 = iVar8 + iVar10 + 0x10000 >> 0x11;
        uVar3 = -(-0x81 < iVar11);
        if ((char)iVar11 == iVar11) {
          uVar3 = (char)iVar11 + 0x80;
        }
        puVar2[-4] = uVar3;
        iVar11 = (iVar8 + 0x10000) - iVar10 >> 0x11;
        uVar3 = -(-0x81 < iVar11);
        if ((char)iVar11 == iVar11) {
          uVar3 = (char)iVar11 + 0x80;
        }
        puVar2[-3] = uVar3;
        lVar1 = lVar1 + 0x20;
        puVar2 = puVar2 + out_stride;
      } while ((int)lVar1 != 0x11c);
      return;
    }
  } while( true );
}

Assistant:

static void idct_block(uint8 *out, int out_stride, short data[64], uint8 *dequantize)
{
   int i,val[64],*v=val;
   uint8 *o,*dq = dequantize;
   short *d = data;

   // columns
   for (i=0; i < 8; ++i,++d,++dq, ++v) {
      // if all zeroes, shortcut -- this avoids dequantizing 0s and IDCTing
      if (d[ 8]==0 && d[16]==0 && d[24]==0 && d[32]==0
           && d[40]==0 && d[48]==0 && d[56]==0) {
         //    no shortcut                 0     seconds
         //    (1|2|3|4|5|6|7)==0          0     seconds
         //    all separate               -0.047 seconds
         //    1 && 2|3 && 4|5 && 6|7:    -0.047 seconds
         int dcterm = d[0] * dq[0] << 2;
         v[0] = v[8] = v[16] = v[24] = v[32] = v[40] = v[48] = v[56] = dcterm;
      } else {
         IDCT_1D(d[ 0]*dq[ 0],d[ 8]*dq[ 8],d[16]*dq[16],d[24]*dq[24],
                 d[32]*dq[32],d[40]*dq[40],d[48]*dq[48],d[56]*dq[56])
         // constants scaled things up by 1<<12; let's bring them back
         // down, but keep 2 extra bits of precision
         x0 += 512; x1 += 512; x2 += 512; x3 += 512;
         v[ 0] = (x0+t3) >> 10;
         v[56] = (x0-t3) >> 10;
         v[ 8] = (x1+t2) >> 10;
         v[48] = (x1-t2) >> 10;
         v[16] = (x2+t1) >> 10;
         v[40] = (x2-t1) >> 10;
         v[24] = (x3+t0) >> 10;
         v[32] = (x3-t0) >> 10;
      }
   }

   for (i=0, v=val, o=out; i < 8; ++i,v+=8,o+=out_stride) {
      // no fast case since the first 1D IDCT spread components out
      IDCT_1D(v[0],v[1],v[2],v[3],v[4],v[5],v[6],v[7])
      // constants scaled things up by 1<<12, plus we had 1<<2 from first
      // loop, plus horizontal and vertical each scale by sqrt(8) so together
      // we've got an extra 1<<3, so 1<<17 total we need to remove.
      x0 += 65536; x1 += 65536; x2 += 65536; x3 += 65536;
      o[0] = clamp((x0+t3) >> 17);
      o[7] = clamp((x0-t3) >> 17);
      o[1] = clamp((x1+t2) >> 17);
      o[6] = clamp((x1-t2) >> 17);
      o[2] = clamp((x2+t1) >> 17);
      o[5] = clamp((x2-t1) >> 17);
      o[3] = clamp((x3+t0) >> 17);
      o[4] = clamp((x3-t0) >> 17);
   }
}